

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall
discordpp::MessageComponentData::MessageComponentData
          (MessageComponentData *this,MessageComponentData *param_1)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  pointer *__ptr;
  
  ResolvedData::ResolvedData(&this->super_ResolvedData,&param_1->super_ResolvedData);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->custom_id,&param_1->custom_id);
  _Var1._M_head_impl =
       (param_1->component_type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl == (int *)0x0) {
    _Var2._M_head_impl = (int *)0x0;
  }
  else {
    _Var2._M_head_impl = (int *)operator_new(4);
    *_Var2._M_head_impl = *_Var1._M_head_impl;
  }
  (this->component_type).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (this->component_type).s_ = (param_1->component_type).s_;
  field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>::field
            (&(this->values).
              super_field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>
             ,&(param_1->values).
               super_field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>
            );
  (this->values)._vptr_omittable_field = (_func_int **)&PTR_operator__0024bcc0;
  return;
}

Assistant:

MessageComponentData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted,
        field<std::string> custom_id = uninitialized,
        field<int> component_type = uninitialized,
        omittable_field<std::vector<SelectOption> > values = omitted
    ):
        ResolvedData(
            users,
            members,
            roles,
            channels,
            messages,
            attachments
        ),
        custom_id(custom_id),
        component_type(component_type),
        values(values)
    {}